

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::Builder::Builder(Builder *this,VersionSet *vset,Version *base)

{
  long lVar1;
  allocator_type *paVar2;
  InternalKeyComparator *pIVar3;
  allocator_type *paVar4;
  InternalKeyComparator *in_RDX;
  InternalKeyComparator *in_RSI;
  BySmallestKey *in_RDI;
  long in_FS_OFFSET;
  int level;
  BySmallestKey cmp;
  Version *in_stack_ffffffffffffff68;
  allocator_type *this_00;
  allocator_type *local_50;
  int local_34;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->internal_comparator = in_RSI;
  in_RDI[1].internal_comparator = in_RDX;
  this_00 = (allocator_type *)(in_RDI + 2);
  paVar4 = (allocator_type *)(in_RDI + 0x33);
  paVar2 = this_00;
  do {
    local_50 = paVar2;
    LevelState::LevelState((LevelState *)in_stack_ffffffffffffff68);
    paVar2 = local_50 + 0x38;
  } while (local_50 + 0x38 != paVar4);
  Version::Ref(in_stack_ffffffffffffff68);
  for (local_34 = 0; local_34 < 7; local_34 = local_34 + 1) {
    pIVar3 = (InternalKeyComparator *)operator_new(0x30);
    std::allocator<leveldb::FileMetaData_*>::allocator
              ((allocator<leveldb::FileMetaData_*> *)in_stack_ffffffffffffff68);
    std::
    set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::set((set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
           *)this_00,in_RDI,local_50);
    in_RDI[(long)local_34 * 7 + 8].internal_comparator = pIVar3;
    std::allocator<leveldb::FileMetaData_*>::~allocator
              ((allocator<leveldb::FileMetaData_*> *)in_stack_ffffffffffffff68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Builder(VersionSet* vset, Version* base) : vset_(vset), base_(base) {
    base_->Ref();
    BySmallestKey cmp;
    cmp.internal_comparator = &vset_->icmp_;
    for (int level = 0; level < config::kNumLevels; level++) {
      levels_[level].added_files = new FileSet(cmp);
    }
  }